

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

SavedPos __thiscall FScanner::SavePos(FScanner *this)

{
  SavedPos SVar1;
  FScanner *this_local;
  SavedPos pos;
  
  CheckOpen(this);
  if ((this->End & 1U) == 0) {
    this_local = (FScanner *)this->ScriptPtr;
  }
  else {
    this_local = (FScanner *)0x0;
  }
  SVar1.SavedScriptLine = this->Line;
  SVar1.SavedScriptPtr = (char *)this_local;
  SVar1._12_4_ = 0;
  return SVar1;
}

Assistant:

const FScanner::SavedPos FScanner::SavePos ()
{
	SavedPos pos;

	CheckOpen ();
	if (End)
	{
		pos.SavedScriptPtr = NULL;
	}
	else
	{
		pos.SavedScriptPtr = ScriptPtr;
	}
	pos.SavedScriptLine = Line;
	return pos;
}